

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

void asmjit::CodeHolder_resetInternal(CodeHolder *self,uint32_t resetPolicy)

{
  size_type *psVar1;
  Error EVar2;
  Error EVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  void *pvVar5;
  undefined4 extraout_var;
  uint64_t extraout_RDX;
  CodeHolder *unaff_RBX;
  ulong uVar6;
  uint uVar7;
  ulong unaff_RBP;
  undefined4 in_register_00000034;
  BaseEmitter *pBVar8;
  CodeHolder *pCVar9;
  ZoneAllocator *unaff_R12;
  ulong unaff_R13;
  uint64_t unaff_R14;
  BaseEmitter *unaff_R15;
  ulong uVar10;
  
  pBVar8 = (BaseEmitter *)CONCAT44(in_register_00000034,resetPolicy);
  do {
    *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
    *(BaseEmitter **)((long)register0x00000020 + -0x10) = unaff_R15;
    *(uint64_t *)((long)register0x00000020 + -0x18) = unaff_R14;
    *(ulong *)((long)register0x00000020 + -0x20) = unaff_R13;
    *(ZoneAllocator **)((long)register0x00000020 + -0x28) = unaff_R12;
    *(CodeHolder **)((long)register0x00000020 + -0x30) = unaff_RBX;
    *(undefined8 *)((long)register0x00000020 + -0x38) = in_RAX;
    uVar6 = (ulong)pBVar8 & 0xffffffff;
    uVar10 = (ulong)(self->_emitters).super_ZoneVectorBase._size;
    unaff_R15 = pBVar8;
    unaff_RBX = self;
    while (uVar10 != 0) {
      uVar10 = uVar10 - 1;
      if ((self->_emitters).super_ZoneVectorBase._size <= uVar10) {
        *(undefined8 *)((long)register0x00000020 + -0x40) = 0x113a6a;
        CodeHolder_resetInternal();
        goto LAB_00113a6a;
      }
      unaff_R15 = *(BaseEmitter **)((long)(self->_emitters).super_ZoneVectorBase._data + uVar10 * 8)
      ;
      *(undefined8 *)((long)register0x00000020 + -0x40) = 0x113953;
      unaff_RBX = self;
      CodeHolder::detach(self,unaff_R15);
    }
    *(int *)((long)register0x00000020 + -0x34) = (int)pBVar8;
    (self->_environment)._arch = '\0';
    (self->_environment)._subArch = '\0';
    (self->_environment)._vendor = '\0';
    (self->_environment)._platform = '\0';
    (self->_environment)._abi = '\0';
    (self->_environment)._format = '\0';
    (self->_environment)._reserved = 0;
    self->_baseAddress = 0xffffffffffffffff;
    unaff_R12 = (ZoneAllocator *)&self->_sections;
    self->_logger = (Logger *)0x0;
    self->_errorHandler = (ErrorHandler *)0x0;
    uVar10 = (ulong)(self->_sections).super_ZoneVectorBase._size;
    if (uVar10 == 0) {
LAB_001139c8:
      (self->_emitters).super_ZoneVectorBase._data = (void *)0x0;
      (self->_emitters).super_ZoneVectorBase._size = 0;
      (self->_emitters).super_ZoneVectorBase._capacity = 0;
      (self->_namedLabels).super_ZoneHashBase._data =
           (self->_namedLabels).super_ZoneHashBase._embedded;
      (self->_namedLabels).super_ZoneHashBase._size = 0;
      (self->_namedLabels).super_ZoneHashBase._bucketsCount = 1;
      (self->_namedLabels).super_ZoneHashBase._bucketsGrow = 1;
      (self->_namedLabels).super_ZoneHashBase._rcpValue = 1;
      (self->_namedLabels).super_ZoneHashBase._rcpShift = '\0';
      (self->_namedLabels).super_ZoneHashBase._primeIndex = '\0';
      (self->_relocations).super_ZoneVectorBase._data = (void *)0x0;
      (self->_relocations).super_ZoneVectorBase._size = 0;
      (self->_relocations).super_ZoneVectorBase._capacity = 0;
      (self->_labelEntries).super_ZoneVectorBase._data = (void *)0x0;
      (self->_labelEntries).super_ZoneVectorBase._size = 0;
      (self->_labelEntries).super_ZoneVectorBase._capacity = 0;
      (self->_sectionsByOrder).super_ZoneVectorBase._data = (void *)0x0;
      (self->_sectionsByOrder).super_ZoneVectorBase._size = 0;
      (self->_sectionsByOrder).super_ZoneVectorBase._capacity = 0;
      (((ZoneVector<asmjit::Section_*> *)unaff_R12)->super_ZoneVectorBase)._data = (void *)0x0;
      (self->_sections).super_ZoneVectorBase._size = 0;
      (self->_sections).super_ZoneVectorBase._capacity = 0;
      self->_addressTableSection = (Section *)0x0;
      (self->_addressTableEntries)._root = (AddressTableEntry *)0x0;
      (self->_namedLabels).super_ZoneHashBase._embedded[0] = (ZoneHashNode *)0x0;
      self->_unresolvedLinkCount = 0;
      *(undefined8 *)((long)register0x00000020 + -0x40) = 0x113a4b;
      ZoneAllocator::reset(&self->_allocator,&self->_zone);
      Zone::reset(&self->_zone,*(uint32_t *)((long)register0x00000020 + -0x34));
      return;
    }
    unaff_R13 = 0;
    unaff_RBP = 0;
    while (unaff_RBP < (self->_sections).super_ZoneVectorBase._size) {
      uVar6 = *(ulong *)((long)(((ZoneVector<asmjit::Section_*> *)unaff_R12)->super_ZoneVectorBase).
                               _data + unaff_RBP * 8);
      unaff_RBX = *(CodeHolder **)(uVar6 + 0x48);
      if ((unaff_RBX != (CodeHolder *)0x0) && ((*(byte *)(uVar6 + 0x60) & 1) == 0)) {
        *(undefined8 *)((long)register0x00000020 + -0x40) = 0x1139b8;
        free(unaff_RBX);
      }
      *(undefined8 *)(uVar6 + 0x48) = 0;
      *(undefined8 *)(uVar6 + 0x58) = 0;
      unaff_RBP = unaff_RBP + 1;
      if (uVar10 == unaff_RBP) goto LAB_001139c8;
    }
LAB_00113a6a:
    *(undefined8 *)((long)register0x00000020 + -0x40) = 0x113a6f;
    CodeHolder_resetInternal();
    *(ulong *)((long)register0x00000020 + -0x40) = unaff_RBP;
    *(ulong *)((long)register0x00000020 + -0x48) = uVar10;
    *(CodeHolder **)((long)register0x00000020 + -0x50) = self;
    *(ulong *)((long)register0x00000020 + -0x58) = unaff_R13;
    *(ZoneAllocator **)((long)register0x00000020 + -0x60) = unaff_R12;
    *(ulong *)((long)register0x00000020 + -0x68) = uVar6;
    *(undefined8 *)((long)register0x00000020 + -0x70) = extraout_RAX;
    if ((unaff_RBX->_environment)._arch != '\0') {
      return;
    }
    pCVar9 = unaff_RBX;
    if ((unaff_RBX->_emitters).super_ZoneVectorBase._size != 0) {
      *(undefined8 *)((long)register0x00000020 + -0x78) = 0x113ba8;
      CodeHolder::init((EVP_PKEY_CTX *)unaff_RBX);
LAB_00113ba8:
      *(undefined8 *)((long)register0x00000020 + -0x78) = 0x113bad;
      CodeHolder::init((EVP_PKEY_CTX *)pCVar9);
LAB_00113b03:
      *(undefined8 *)((long)register0x00000020 + -0x78) = 0x113b11;
      Zone::reset(&unaff_RBX->_zone,0);
      return;
    }
    unaff_R12 = &unaff_RBX->_allocator;
    EVar3 = 0;
    unaff_R13 = 0;
    if ((unaff_RBX->_sections).super_ZoneVectorBase._capacity ==
        (unaff_RBX->_sections).super_ZoneVectorBase._size) {
      pCVar9 = (CodeHolder *)&unaff_RBX->_sections;
      *(undefined8 *)((long)register0x00000020 + -0x78) = 0x113ad2;
      EVar2 = ZoneVectorBase::_grow((ZoneVectorBase *)pCVar9,unaff_R12,8,1);
      unaff_R13 = (ulong)EVar2;
    }
    if ((unaff_RBX->_sectionsByOrder).super_ZoneVectorBase._capacity ==
        (unaff_RBX->_sectionsByOrder).super_ZoneVectorBase._size) {
      pCVar9 = (CodeHolder *)&unaff_RBX->_sectionsByOrder;
      *(undefined8 *)((long)register0x00000020 + -0x78) = 0x113afc;
      EVar3 = ZoneVectorBase::_grow((ZoneVectorBase *)pCVar9,unaff_R12,8,1);
    }
    uVar7 = EVar3 | (uint)unaff_R13;
    unaff_RBP = (ulong)uVar7;
    if (uVar7 != 0) goto LAB_00113b03;
    if (unaff_R12->_zone == (Zone *)0x0) goto LAB_00113ba8;
    pBVar8 = (BaseEmitter *)0x68;
    *(undefined8 *)((long)register0x00000020 + -0x78) = 0x113b2e;
    self = (CodeHolder *)unaff_R12;
    pvVar5 = ZoneAllocator::_allocZeroed
                       (unaff_R12,0x68,(size_t *)((long)register0x00000020 + -0x70));
    if (pvVar5 == (void *)0x0) goto LAB_00113b03;
    *(undefined4 *)((long)pvVar5 + 4) = 3;
    *(undefined8 *)((long)pvVar5 + 0x20) = 0x747865742e;
    uVar7 = (unaff_RBX->_sections).super_ZoneVectorBase._size;
    if (uVar7 < (unaff_RBX->_sections).super_ZoneVectorBase._capacity) {
      *(void **)((long)(unaff_RBX->_sections).super_ZoneVectorBase._data + (ulong)uVar7 * 8) =
           pvVar5;
      psVar1 = &(unaff_RBX->_sections).super_ZoneVectorBase._size;
      *psVar1 = *psVar1 + 1;
      uVar7 = (unaff_RBX->_sectionsByOrder).super_ZoneVectorBase._size;
      if (uVar7 < (unaff_RBX->_sectionsByOrder).super_ZoneVectorBase._capacity) {
        *(void **)((long)(unaff_RBX->_sectionsByOrder).super_ZoneVectorBase._data + (ulong)uVar7 * 8
                  ) = pvVar5;
        psVar1 = &(unaff_RBX->_sectionsByOrder).super_ZoneVectorBase._size;
        *psVar1 = *psVar1 + 1;
        unaff_RBX->_environment = (Environment)unaff_R15->_vptr_BaseEmitter;
        unaff_RBX->_baseAddress = extraout_RDX;
        return;
      }
    }
    else {
      *(undefined8 *)((long)register0x00000020 + -0x78) = 0x113bbc;
      CodeHolder::init((EVP_PKEY_CTX *)self);
    }
    *(undefined8 *)((long)register0x00000020 + -0x78) = 0x113bc1;
    iVar4 = CodeHolder::init((EVP_PKEY_CTX *)self);
    in_RAX = CONCAT44(extraout_var,iVar4);
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x70);
    unaff_R14 = extraout_RDX;
  } while( true );
}

Assistant:

static void CodeHolder_resetInternal(CodeHolder* self, uint32_t resetPolicy) noexcept {
  uint32_t i;
  const ZoneVector<BaseEmitter*>& emitters = self->emitters();

  i = emitters.size();
  while (i)
    self->detach(emitters[--i]);

  // Reset everything into its construction state.
  self->_environment.reset();
  self->_baseAddress = Globals::kNoBaseAddress;
  self->_logger = nullptr;
  self->_errorHandler = nullptr;

  // Reset all sections.
  uint32_t numSections = self->_sections.size();
  for (i = 0; i < numSections; i++) {
    Section* section = self->_sections[i];
    if (section->_buffer.data() && !section->_buffer.isExternal())
      ::free(section->_buffer._data);
    section->_buffer._data = nullptr;
    section->_buffer._capacity = 0;
  }

  // Reset zone allocator and all containers using it.
  ZoneAllocator* allocator = self->allocator();

  self->_emitters.reset();
  self->_namedLabels.reset();
  self->_relocations.reset();
  self->_labelEntries.reset();
  self->_sections.reset();
  self->_sectionsByOrder.reset();

  self->_unresolvedLinkCount = 0;
  self->_addressTableSection = nullptr;
  self->_addressTableEntries.reset();

  allocator->reset(&self->_zone);
  self->_zone.reset(resetPolicy);
}